

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error.cpp
# Opt level: O1

void underline(int offset,int left,int right,char *text)

{
  long lVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  
  if (1 < offset) {
    iVar5 = offset + 1;
    do {
      fputc(0x2d,_stderr);
      iVar5 = iVar5 + -1;
    } while (2 < iVar5);
  }
  uVar6 = offset;
  if (0 < left) {
    uVar4 = 0;
    do {
      iVar5 = 1;
      if (text[uVar4] == '\t') {
        uVar3 = uVar6 + 7;
        if (-1 < (int)uVar6) {
          uVar3 = uVar6;
        }
        iVar5 = ((uVar3 & 0xfffffff8) - uVar6) + 8;
      }
      uVar6 = iVar5 + uVar6;
      uVar4 = uVar4 + 1;
    } while ((uint)left != uVar4);
  }
  if (uVar6 - offset != -1) {
    iVar5 = ~uVar6 + offset;
    do {
      fputc(0x20,_stderr);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  uVar3 = uVar6;
  if (left <= right) {
    lVar1 = 0;
    do {
      iVar5 = 1;
      if (text[lVar1 + left] == '\t') {
        uVar2 = uVar3 + 7;
        if (-1 < (int)uVar3) {
          uVar2 = uVar3;
        }
        iVar5 = ((uVar2 & 0xfffffff8) - uVar3) + 8;
      }
      uVar3 = iVar5 + uVar3;
      lVar1 = lVar1 + 1;
    } while ((right - left) + 1 != (int)lVar1);
  }
  if (uVar3 != uVar6) {
    iVar5 = uVar6 - uVar3;
    do {
      fputc(0x5e,_stderr);
      iVar5 = iVar5 + 1;
    } while (iVar5 != 0);
  }
  return;
}

Assistant:

static void underline(int offset, int left, int right, const char *text) {
	auto column = offset;
	while (--offset > 0)
		fputc('-', stderr);
	auto column_ref = column;
	for (auto i = 0; i < left; ++i)
		column += (text[i] == '\t') ? 8 - column % 8 : 1;
	fputnc(' ', column - column_ref + 1, stderr);

	column_ref = column;
	for (auto i = left; i <= right;  ++i)
		column += text[i] == '\t' ? 8 - column % 8 : 1;
	fputnc('^', column - column_ref, stderr);

	// fprintf(stderr, " %d %d %d", offset, left, right);
}